

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

shared_ptr<kratos::Var> __thiscall
kratos::EnableStmtVisitor::get_cond(EnableStmtVisitor *this,Stmt *stmt)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  string *psVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  Expr *pEVar4;
  _Rb_tree_node_base *p_Var5;
  StmtException *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  uint64_t i;
  ulong uVar7;
  shared_ptr<kratos::Var> *this_02;
  long lVar8;
  shared_ptr<kratos::Var> sVar9;
  initializer_list<kratos::IRNode_*> __l;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_b8;
  Stmt *local_a8;
  element_type *local_a0;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 auStack_88 [8];
  shared_ptr<kratos::Var> or_;
  undefined1 auStack_68 [8];
  shared_ptr<kratos::Var> expr;
  shared_ptr<kratos::Var> rest_expr;
  allocator_type local_31;
  Stmt *stmt_00;
  
  iVar3 = (*(stmt->super_IRNode)._vptr_IRNode[4])(stmt);
  stmt_00 = (Stmt *)CONCAT44(extraout_var,iVar3);
  if ((stmt_00->super_IRNode).ast_node_type_ == GeneratorKind) {
    (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)0x0;
    *(undefined8 *)&(this->super_IRVisitor).level = 0;
    _Var6._M_pi = extraout_RDX;
    goto LAB_001fe92a;
  }
  auStack_68 = (undefined1  [8])0x0;
  expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  if (stmt_00->type_ == Switch) {
    p_Var5 = (_Rb_tree_node_base *)stmt_00[1].super_IRNode.comment.field_2._M_allocated_capacity;
    psVar1 = &stmt_00[1].super_IRNode.comment;
    while( true ) {
      if (p_Var5 == (_Rb_tree_node_base *)psVar1) {
        this_01 = (StmtException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   "Incorrect statement block stage",(allocator<char> *)&local_b8);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_98;
        local_98._M_ptr = (element_type *)stmt;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_88,__l,
                   &local_31);
        StmtException::StmtException
                  (this_01,(string *)
                           &expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                   (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_88);
        __cxa_throw(this_01,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((Stmt *)p_Var5[1]._M_left == stmt) break;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    }
    if (*(long *)(p_Var5 + 1) != 0) {
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_88,
                 (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(stmt_00 + 1));
      pEVar4 = Var::eq((Var *)auStack_88,*(Var **)(p_Var5 + 1));
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
                 &expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(pEVar4->super_Var).super_enable_shared_from_this<kratos::Var>);
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_68,
                 (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rest_expr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&or_);
      if (auStack_68 != (undefined1  [8])0x0) goto LAB_001fe8d4;
    }
    auStack_88 = (undefined1  [8])0x0;
    or_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
    reserve((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
             *)&expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
            *(size_type *)&stmt_00[1].super_IRNode.ast_node_type_);
    for (p_Var5 = (_Rb_tree_node_base *)
                  stmt_00[1].super_IRNode.comment.field_2._M_allocated_capacity;
        p_Var5 != (_Rb_tree_node_base *)psVar1;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if (*(long *)(p_Var5 + 1) != 0) {
        std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
        emplace_back<std::shared_ptr<kratos::Const>const&>
                  ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
                    *)&expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (shared_ptr<kratos::Const> *)(p_Var5 + 1));
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::EnableStmtVisitor::get_cond(kratos::Stmt*)::_lambda(std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Const>const&)_1_>>
              (expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
               rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_a8 = stmt_00;
    local_a0 = (element_type *)this;
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_88,
               (__shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *)
               expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    if (0x10 < (ulong)((long)rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr -
                      (long)expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)) {
      lVar8 = 0x10;
      for (uVar7 = 1;
          uVar7 < (ulong)((long)rest_expr.
                                super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                          (long)expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi >> 4); uVar7 = uVar7 + 1) {
        pEVar4 = Var::operator||((Var *)auStack_88,
                                 *(Var **)((long)&(expr.
                                                  super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                                          lVar8));
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_98,
                   (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                   &(pEVar4->super_Var).super_enable_shared_from_this<kratos::Var>);
        std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_88,&local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
        lVar8 = lVar8 + 0x10;
      }
    }
    stmt_00 = local_a8;
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,(__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 1));
    pEVar4 = Var::operator!=(local_b8._M_ptr,(Var *)auStack_88);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_98,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &(pEVar4->super_Var).super_enable_shared_from_this<kratos::Var>);
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_68,&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
    ~vector((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
             *)&expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&or_);
    this = (EnableStmtVisitor *)local_a0;
LAB_001fe8d4:
    get_cond((EnableStmtVisitor *)
             &expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,stmt_00);
    peVar2 = expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (((element_type *)this)->super_IRNode)._vptr_IRNode = (_func_int **)auStack_68;
      expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (((element_type *)this)->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar2;
      auStack_68 = (undefined1  [8])0x0;
    }
    else {
      pEVar4 = Var::operator&&((Var *)auStack_68,
                               (Var *)expr.
                                      super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(pEVar4->super_Var).super_enable_shared_from_this<kratos::Var>);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rest_expr);
  }
  else {
    if (stmt_00->type_ == If) {
      if (*(Stmt **)&stmt_00[1].super_IRNode.verilog_ln == stmt) {
        this_00 = &expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                   (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(stmt_00 + 1));
        std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_68,
                   (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)this_00);
        this_02 = &rest_expr;
      }
      else {
        std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_88,
                   (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(stmt_00 + 1));
        pEVar4 = Var::r_not((Var *)auStack_88);
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
                   &expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                   &(pEVar4->super_Var).super_enable_shared_from_this<kratos::Var>);
        std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_68,
                   (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                   &expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rest_expr);
        this_02 = &or_;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_02);
      goto LAB_001fe8d4;
    }
    get_cond(this,stmt_00);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr);
  _Var6._M_pi = extraout_RDX_00;
LAB_001fe92a:
  sVar9.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar9.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar9.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Var> get_cond(Stmt* stmt) {
        auto* ir_parent = stmt->parent();
        if (ir_parent->ir_node_kind() == IRNodeKind::GeneratorKind) {
            return nullptr;
        }
        auto* parent_stmt = reinterpret_cast<Stmt*>(ir_parent);
        std::shared_ptr<Var> expr;
        if (parent_stmt->type() == StatementType::If) {
            // need to figure out which block it belongs to
            auto* if_ = reinterpret_cast<IfStmt*>(parent_stmt);
            if (if_->then_body().get() == stmt) {
                expr = if_->predicate();
            } else {
                expr = if_->predicate()->r_not().shared_from_this();
            }
        } else if (parent_stmt->type() == StatementType::Switch) {
            auto* switch_ = reinterpret_cast<SwitchStmt*>(parent_stmt);
            // figure out which condition it is in. notice that we could be in the default
            // branch as well
            auto const& body = switch_->body();
            bool found = false;
            for (auto const& [cond, stmt_blk] : body) {
                if (stmt_blk.get() == stmt) {
                    // it's this condition
                    if (cond) expr = switch_->target()->eq(*cond).shared_from_this();
                    found = true;
                    break;
                }
            }
            if (!found) {
                throw StmtException("Incorrect statement block stage", {stmt});
            }
            if (!expr) {
                // it's the default one. we nor them together
                std::shared_ptr<Var> or_;
                std::vector<std::shared_ptr<Const>> conditions;
                conditions.reserve(body.size());
                for (auto const& [cond, stmt_blk] : body) {
                    if (cond) conditions.emplace_back(cond);
                }
                // sort conditions based on the value. it's guarantee to be unique
                // so no problems of overlap
                std::sort(
                    conditions.begin(), conditions.end(),
                    [](const std::shared_ptr<Const>& left, const std::shared_ptr<Const>& right) {
                        return left->value() < right->value();
                    });
                or_ = conditions[0];
                if (conditions.size() > 1) {
                    for (uint64_t i = 1; i < conditions.size(); i++) {
                        or_ = or_->operator||(*conditions[i]).shared_from_this();
                    }
                }
                expr = (switch_->target()->operator!=(*or_)).shared_from_this();
            }
        } else {
            return get_cond(parent_stmt);
        }
        auto rest_expr = get_cond(parent_stmt);
        if (rest_expr) {
            return expr->operator&&(*rest_expr).shared_from_this();
        } else {
            return expr;
        }
    }